

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

int GetKeyFromName(char *name)

{
  int iVar1;
  int local_1c;
  int i;
  char *name_local;
  
  if ((*name == '#') && (name[1] != '\0')) {
    name_local._4_4_ = atoi(name + 1);
  }
  else {
    for (local_1c = 0; local_1c < 0x1c4; local_1c = local_1c + 1) {
      if ((KeyNames[local_1c] != (char *)0x0) &&
         (iVar1 = strcasecmp(KeyNames[local_1c],name), iVar1 == 0)) {
        return local_1c;
      }
    }
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

static int GetKeyFromName (const char *name)
{
	int i;

	// Names of the form #xxx are translated to key xxx automatically
	if (name[0] == '#' && name[1] != 0)
	{
		return atoi (name + 1);
	}

	// Otherwise, we scan the KeyNames[] array for a matching name
	for (i = 0; i < NUM_KEYS; i++)
	{
		if (KeyNames[i] && !stricmp (KeyNames[i], name))
			return i;
	}
	return 0;
}